

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
anon_unknown.dwarf_c3752::EvaluateExpression
          (ExpressionContext *ctx,SynBase *source,ExprBase *expression)

{
  char *pcVar1;
  Allocator *pAVar2;
  Lexeme *pLVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  size_t sVar7;
  undefined4 extraout_var_00;
  char *pcVar8;
  ulong uVar9;
  StackVariable *__s;
  ErrorInfo *local_2b0;
  ExpressionEvalContext local_2a8;
  StackFrame *pSVar5;
  
  local_2a8.stackFrames.allocator = ctx->allocator;
  local_2a8.stackFrames.data = local_2a8.stackFrames.little;
  local_2a8.stackFrames.count = 0;
  local_2a8.stackFrames.max = 0x20;
  local_2a8.abandonedMemory.data = local_2a8.abandonedMemory.little;
  local_2a8.abandonedMemory.count = 0;
  local_2a8.abandonedMemory.max = 0x20;
  local_2a8.errorBuf = (char *)0x0;
  local_2a8.errorBufSize = 0;
  local_2a8.errorCritical = false;
  local_2a8.globalFrame = (StackFrame *)0x0;
  local_2a8.emulateKnownExternals = false;
  local_2a8.stackDepthLimit = 0x40;
  local_2a8.variableMemoryLimit = 0x2000;
  local_2a8.totalMemory = 0;
  local_2a8.totalMemoryLimit = 0x10000;
  local_2a8.instruction = 0;
  local_2a8.instructionsLimit = 0x10000;
  local_2a8.expressionDepth = 0;
  local_2a8.expressionDepthLimit = 0x800;
  pcVar8 = ctx->errorBuf;
  if (pcVar8 != (char *)0x0) {
    if (ctx->errorBufSize != 0) {
      pcVar1 = ctx->errorBufLocation;
      local_2a8.errorBuf = pcVar1;
      if (pcVar1 == (char *)0x0) {
        local_2a8.errorBuf = pcVar8;
      }
      iVar4 = 0;
      if (pcVar1 != (char *)0x0) {
        iVar4 = (int)pcVar8 - (int)pcVar1;
      }
      local_2a8.errorBufSize = iVar4 + ctx->errorBufSize;
    }
  }
  local_2a8.ctx = ctx;
  local_2a8.abandonedMemory.allocator = local_2a8.stackFrames.allocator;
  iVar4 = (*(local_2a8.stackFrames.allocator)->_vptr_Allocator[2])();
  pSVar5 = (StackFrame *)CONCAT44(extraout_var,iVar4);
  pAVar2 = ctx->allocator;
  pSVar5->owner = (FunctionData *)0x0;
  __s = (pSVar5->variables).little;
  memset(__s,0,0x200);
  (pSVar5->variables).allocator = pAVar2;
  (pSVar5->variables).data = __s;
  (pSVar5->variables).count = 0;
  (pSVar5->variables).max = 0x20;
  pSVar5->returnValue = (ExprBase *)0x0;
  pSVar5->targetYield = 0;
  pSVar5->breakDepth = 0;
  pSVar5->continueDepth = 0;
  local_2a8.globalFrame = pSVar5;
  if (local_2a8.stackFrames.count == local_2a8.stackFrames.max) {
    SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::grow
              (&local_2a8.stackFrames,local_2a8.stackFrames.count);
  }
  if (local_2a8.stackFrames.data != (StackFrame **)0x0) {
    uVar9 = local_2a8.stackFrames._8_8_ & 0xffffffff;
    local_2a8.stackFrames.count = local_2a8.stackFrames.count + 1;
    local_2a8.stackFrames.data[uVar9] = local_2a8.globalFrame;
    pEVar6 = Evaluate(&local_2a8,expression);
    if (local_2a8.errorCritical != true) {
      if (((pEVar6 == (ExprBase *)0x0) && (ctx->errorBuf != (char *)0x0)) &&
         (ctx->errorBufSize != 0)) {
        *local_2a8.errorBuf = '\0';
      }
      SmallArray<ExprPointerLiteral_*,_32U>::~SmallArray(&local_2a8.abandonedMemory);
      SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::~SmallArray(&local_2a8.stackFrames);
      return pEVar6;
    }
    pcVar8 = ctx->errorBuf;
    if ((pcVar8 != (char *)0x0) && (ctx->errorBufSize != 0)) {
      if (ctx->errorCount == 0) {
        ctx->errorPos = (source->pos).begin;
        ctx->errorBufLocation = pcVar8;
      }
      else {
        pcVar8 = ctx->errorBufLocation;
      }
      sVar7 = strlen(pcVar8);
      ctx->errorBufLocation = pcVar8 + sVar7;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      local_2b0 = (ErrorInfo *)CONCAT44(extraout_var_00,iVar4);
      pAVar2 = ctx->allocator;
      pcVar1 = ctx->errorPos;
      local_2b0->messageStart = pcVar8;
      local_2b0->messageEnd = pcVar8 + sVar7;
      pLVar3 = source->end;
      local_2b0->begin = source->begin;
      local_2b0->end = pLVar3;
      local_2b0->pos = pcVar1;
      (local_2b0->related).allocator = pAVar2;
      (local_2b0->related).data = (local_2b0->related).little;
      (local_2b0->related).count = 0;
      (local_2b0->related).max = 4;
      local_2b0->parentModule = (ModuleData *)0x0;
      SmallArray<ErrorInfo_*,_4U>::push_back(&ctx->errorInfo,&local_2b0);
      pcVar8 = FindModuleCodeWithSourceLocation(ctx,ctx->errorPos);
      if (pcVar8 != (char *)0x0) {
        AddErrorLocationInfo
                  (pcVar8,ctx->errorPos,ctx->errorBufLocation,
                   (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
        pcVar8 = ctx->errorBufLocation;
        sVar7 = strlen(pcVar8);
        ctx->errorBufLocation = pcVar8 + sVar7;
      }
    }
    longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<ExpressionEvalContext::StackFrame *, 32>::push_back(const T &) [T = ExpressionEvalContext::StackFrame *, N = 32]"
               );
}

Assistant:

ExprBase* EvaluateExpression(ExpressionContext &ctx, SynBase *source, ExprBase *expression)
	{
		ExpressionEvalContext evalCtx(ctx, ctx.allocator);

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			evalCtx.errorBuf = ctx.errorBufLocation ? ctx.errorBufLocation : ctx.errorBuf;
			evalCtx.errorBufSize = ctx.errorBufSize - (ctx.errorBufLocation ? unsigned(ctx.errorBufLocation - ctx.errorBuf) : 0);
		}

		evalCtx.globalFrame = new (ctx.get<ExpressionEvalContext::StackFrame>()) ExpressionEvalContext::StackFrame(ctx.allocator, NULL);
		evalCtx.stackFrames.push_back(evalCtx.globalFrame);

		ExprBase *result = Evaluate(evalCtx, expression);

		if(evalCtx.errorCritical)
		{
			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, ctx.errorPos));

				if(const char *code = FindModuleCodeWithSourceLocation(ctx, ctx.errorPos))
				{
					AddErrorLocationInfo(code, ctx.errorPos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);
				}
			}

			longjmp(ctx.errorHandler, 1);
		}
		else if(!result)
		{
			// Remove non-critical error from buffer
			if(ctx.errorBuf && ctx.errorBufSize)
				*evalCtx.errorBuf = 0;
		}

		return result;
	}